

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall
VRasterizer::rasterize
          (VRasterizer *this,VPath *path,CapStyle cap,JoinStyle join,float width,float miterLimit,
          VRect *clip)

{
  bool bVar1;
  element_type *this_00;
  VRleTask *pVVar2;
  EVP_PKEY_CTX *in_RSI;
  VRect *in_RDI;
  VPath *in_R8;
  undefined4 in_XMM1_Da;
  float miterLimit_00;
  float in_stack_ffffffffffffffd0;
  JoinStyle in_stack_ffffffffffffffd6;
  CapStyle in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffe0;
  
  init((VRasterizer *)in_RDI,in_RSI);
  miterLimit_00 = (float)((ulong)in_RSI >> 0x20);
  bVar1 = VPath::empty((VPath *)0x132389);
  if ((!bVar1) && (bVar1 = vIsZero(0.0), !bVar1)) {
    this_00 = std::
              __shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1323c4);
    pVVar2 = VRasterizerImpl::task(this_00);
    VPath::VPath((VPath *)in_RDI,(VPath *)pVVar2);
    VRleTask::update((VRleTask *)CONCAT44(in_XMM1_Da,in_stack_ffffffffffffffe0),in_R8,
                     in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0,
                     miterLimit_00,in_RDI);
    VPath::~VPath((VPath *)0x132416);
    updateRequest((VRasterizer *)CONCAT44(in_XMM1_Da,in_stack_ffffffffffffffe0));
    return;
  }
  std::__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1323a8);
  VRasterizerImpl::rle((VRasterizerImpl *)0x1323b0);
  VRle::reset((VRle *)0x1323b8);
  return;
}

Assistant:

void VRasterizer::rasterize(VPath path, CapStyle cap, JoinStyle join,
                            float width, float miterLimit, const VRect &clip)
{
    init();
    if (path.empty() || vIsZero(width)) {
        d->rle().reset();
        return;
    }
    d->task().update(std::move(path), cap, join, width, miterLimit, clip);
    updateRequest();
}